

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Own<kj::_::FiberStack,_std::nullptr_t> __thiscall kj::FiberPool::Impl::takeStack(Impl *this)

{
  Waiter *pWVar1;
  _Elt_pointer ppFVar2;
  FiberStack *pFVar3;
  FiberStack *extraout_RDX;
  FiberStack *extraout_RDX_00;
  FiberStack *extraout_RDX_01;
  _func_int **in_RSI;
  Own<kj::_::FiberStack,_std::nullptr_t> OVar4;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  
  lookupCoreLocalFreelist((Impl *)&lock);
  if (lock.mutex == (Mutex *)0x0) {
LAB_003bcd58:
    MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
    lockExclusive((MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                   *)&lock,in_RSI + 3);
    ppFVar2 = ((lock.ptr)->
              super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppFVar2 ==
        ((lock.ptr)->super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>).
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::~Locked(&lock)
      ;
      pFVar3 = (FiberStack *)operator_new(0x20);
      kj::_::FiberStack::FiberStack(pFVar3,(size_t)in_RSI[1]);
      (this->super_Disposer)._vptr_Disposer = in_RSI;
      this->stackSize = (size_t)pFVar3;
      pFVar3 = extraout_RDX_01;
    }
    else {
      if (ppFVar2 ==
          ((lock.ptr)->super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppFVar2 = ((lock.ptr)->
                  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      pFVar3 = ppFVar2[-1];
      std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_back(lock.ptr);
      (this->super_Disposer)._vptr_Disposer = in_RSI;
      this->stackSize = (size_t)pFVar3;
      Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::~Locked(&lock)
      ;
      pFVar3 = extraout_RDX_00;
    }
  }
  else {
    LOCK();
    pWVar1 = *(Waiter **)lock.mutex;
    *(undefined8 *)lock.mutex = 0;
    UNLOCK();
    if (pWVar1 == (Waiter *)0x0) {
      LOCK();
      pWVar1 = ((lock.mutex)->waitersHead).ptr;
      ((lock.mutex)->waitersHead).ptr = (Waiter *)0x0;
      UNLOCK();
      if (pWVar1 == (Waiter *)0x0) goto LAB_003bcd58;
    }
    (this->super_Disposer)._vptr_Disposer = in_RSI;
    this->stackSize = (size_t)pWVar1;
    pFVar3 = extraout_RDX;
  }
  OVar4.ptr = pFVar3;
  OVar4.disposer = &this->super_Disposer;
  return OVar4;
}

Assistant:

Own<_::FiberStack> takeStack() const {
    // Get a stack from the pool. The disposer on the returned Own pointer will return the stack
    // to the pool, provided that reset() has been called to indicate that the stack is not in
    // a weird state.

#if USE_CORE_LOCAL_FREELISTS
    KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
      for (auto& stackPtr: core.stacks) {
        _::FiberStack* result = __atomic_exchange_n(&stackPtr, nullptr, __ATOMIC_ACQUIRE);
        if (result != nullptr) {
          // Found a stack in this slot!
          return { result, *this };
        }
      }
      // No stacks found, fall back to global freelist.
    }
#endif

    {
      auto lock = freelist.lockExclusive();
      if (!lock->empty()) {
        _::FiberStack* result = lock->back();
        lock->pop_back();
        return { result, *this };
      }
    }

    _::FiberStack* result = new _::FiberStack(stackSize);
    return { result, *this };
  }